

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O1

void llb_buildengine_task_needs_input(llb_task_interface_t ti,llb_data_t *key,uintptr_t input_id)

{
  long *local_50 [2];
  long local_40 [2];
  TaskInterface local_30;
  
  local_30.ctx = ti.ctx;
  local_30.impl = ti.impl;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,key->data,key->data + key->length);
  llbuild::core::TaskInterface::request(&local_30,(KeyType *)local_50,input_id);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void llb_buildengine_task_needs_input(llb_task_interface_t ti,
                                      const llb_data_t* key,
                                      uintptr_t input_id) {
  auto coreti = reinterpret_cast<TaskInterface*>(&ti);
  coreti->request(KeyType((const char*)key->data, key->length), input_id);
}